

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  uint uVar26;
  undefined1 (*pauVar27) [16];
  long lVar28;
  ulong uVar29;
  long lVar30;
  byte bVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [16];
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  float fVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar71 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  uint uVar78;
  uint uVar79;
  undefined1 auVar77 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined4 uVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2880 [16];
  Geometry *local_2868;
  ulong local_2860;
  long local_2858;
  undefined1 (*local_2850) [16];
  long local_2848;
  ulong local_2840;
  ulong local_2838;
  RTCFilterFunctionNArguments local_2830;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  RTCHitN local_2790 [16];
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined4 local_2750;
  undefined4 uStack_274c;
  undefined4 uStack_2748;
  undefined4 uStack_2744;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  uint local_2720;
  uint uStack_271c;
  uint uStack_2718;
  uint uStack_2714;
  uint uStack_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar27 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar93 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2400._4_4_ = fVar2;
  local_2400._0_4_ = fVar2;
  local_2400._8_4_ = fVar2;
  local_2400._12_4_ = fVar2;
  local_2400._16_4_ = fVar2;
  local_2400._20_4_ = fVar2;
  local_2400._24_4_ = fVar2;
  local_2400._28_4_ = fVar2;
  auVar65 = ZEXT3264(local_2400);
  fVar68 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2420._4_4_ = fVar68;
  local_2420._0_4_ = fVar68;
  local_2420._8_4_ = fVar68;
  local_2420._12_4_ = fVar68;
  local_2420._16_4_ = fVar68;
  local_2420._20_4_ = fVar68;
  local_2420._24_4_ = fVar68;
  local_2420._28_4_ = fVar68;
  auVar67 = ZEXT3264(local_2420);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar68 = fVar68 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2838 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2840 = uVar39 ^ 0x20;
  uVar42 = local_2838 ^ 0x20;
  iVar32 = (tray->tfar).field_0.i[k];
  auVar47 = ZEXT3264(CONCAT428(iVar32,CONCAT424(iVar32,CONCAT420(iVar32,CONCAT416(iVar32,CONCAT412(
                                                  iVar32,CONCAT48(iVar32,CONCAT44(iVar32,iVar32)))))
                                               )));
  local_23e0._8_4_ = 0x80000000;
  local_23e0._0_8_ = 0x8000000080000000;
  local_23e0._12_4_ = 0x80000000;
  local_23e0._16_4_ = 0x80000000;
  local_23e0._20_4_ = 0x80000000;
  local_23e0._24_4_ = 0x80000000;
  local_23e0._28_4_ = 0x80000000;
  local_2440._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar1;
  local_2440._12_4_ = -fVar1;
  local_2440._16_4_ = -fVar1;
  local_2440._20_4_ = -fVar1;
  local_2440._24_4_ = -fVar1;
  local_2440._28_4_ = -fVar1;
  auVar71 = ZEXT3264(local_2440);
  local_2460._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar2;
  local_2460._12_4_ = -fVar2;
  local_2460._16_4_ = -fVar2;
  local_2460._20_4_ = -fVar2;
  local_2460._24_4_ = -fVar2;
  local_2460._28_4_ = -fVar2;
  auVar77 = ZEXT3264(local_2460);
  local_2480._0_8_ = CONCAT44(fVar68,fVar68) ^ 0x8000000080000000;
  local_2480._8_4_ = -fVar68;
  local_2480._12_4_ = -fVar68;
  local_2480._16_4_ = -fVar68;
  local_2480._20_4_ = -fVar68;
  local_2480._24_4_ = -fVar68;
  local_2480._28_4_ = -fVar68;
  auVar83 = ZEXT3264(local_2480);
  iVar32 = (tray->tnear).field_0.i[k];
  local_24a0._4_4_ = iVar32;
  local_24a0._0_4_ = iVar32;
  local_24a0._8_4_ = iVar32;
  local_24a0._12_4_ = iVar32;
  local_24a0._16_4_ = iVar32;
  local_24a0._20_4_ = iVar32;
  local_24a0._24_4_ = iVar32;
  local_24a0._28_4_ = iVar32;
  auVar85 = ZEXT3264(local_24a0);
  local_24c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24c0._0_16_ = mm_lookupmask_ps._0_16_;
  local_2850 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar56._8_4_ = 0x3f800000;
  auVar56._0_8_ = 0x3f8000003f800000;
  auVar56._12_4_ = 0x3f800000;
  auVar56._16_4_ = 0x3f800000;
  auVar56._20_4_ = 0x3f800000;
  auVar56._24_4_ = 0x3f800000;
  auVar56._28_4_ = 0x3f800000;
  auVar66._8_4_ = 0xbf800000;
  auVar66._0_8_ = 0xbf800000bf800000;
  auVar66._12_4_ = 0xbf800000;
  auVar66._16_4_ = 0xbf800000;
  auVar66._20_4_ = 0xbf800000;
  auVar66._24_4_ = 0xbf800000;
  auVar66._28_4_ = 0xbf800000;
  local_24e0 = vblendvps_avx(auVar56,auVar66,local_24c0);
LAB_005dcb53:
  do {
    pauVar41 = pauVar27 + -1;
    pauVar27 = pauVar27 + -1;
    if (*(float *)(*pauVar41 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar36 = *(ulong *)*pauVar27;
      while ((uVar36 & 8) == 0) {
        auVar69 = auVar71._0_32_;
        auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar39),auVar69,
                                  auVar93._0_32_);
        auVar63 = auVar65._0_32_;
        auVar75 = auVar77._0_32_;
        auVar52 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + local_2838),auVar75,auVar63
                                 );
        auVar66 = vpmaxsd_avx2(ZEXT1632(auVar48),ZEXT1632(auVar52));
        auVar50 = auVar67._0_32_;
        auVar80 = auVar83._0_32_;
        auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar40),auVar80,auVar50);
        auVar56 = vpmaxsd_avx2(ZEXT1632(auVar48),auVar85._0_32_);
        local_2700 = vpmaxsd_avx2(auVar66,auVar56);
        auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + local_2840),auVar69,
                                  auVar93._0_32_);
        auVar52 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar42),auVar75,auVar63);
        auVar66 = vpminsd_avx2(ZEXT1632(auVar48),ZEXT1632(auVar52));
        auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar40 ^ 0x20)),auVar80,
                                  auVar50);
        auVar56 = vpminsd_avx2(ZEXT1632(auVar48),auVar47._0_32_);
        auVar66 = vpminsd_avx2(auVar66,auVar56);
        auVar66 = vpcmpgtd_avx2(local_2700,auVar66);
        iVar32 = vmovmskps_avx(auVar66);
        if (iVar32 == 0xff) {
          if (pauVar27 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005dcb53;
        }
        bVar31 = ~(byte)iVar32;
        uVar29 = uVar36 & 0xfffffffffffffff0;
        lVar30 = 0;
        for (uVar36 = (ulong)bVar31; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
          lVar30 = lVar30 + 1;
        }
        uVar36 = *(ulong *)(uVar29 + lVar30 * 8);
        uVar33 = bVar31 - 1 & (uint)bVar31;
        uVar34 = (ulong)uVar33;
        if (uVar33 != 0) {
          uVar26 = *(uint *)(local_2700 + lVar30 * 4);
          lVar30 = 0;
          for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
            lVar30 = lVar30 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          uVar38 = (ulong)uVar33;
          uVar34 = *(ulong *)(uVar29 + lVar30 * 8);
          uVar78 = *(uint *)(local_2700 + lVar30 * 4);
          if (uVar33 == 0) {
            if (uVar26 < uVar78) {
              *(ulong *)*pauVar27 = uVar34;
              *(uint *)(*pauVar27 + 8) = uVar78;
              pauVar27 = pauVar27 + 1;
            }
            else {
              *(ulong *)*pauVar27 = uVar36;
              *(uint *)(*pauVar27 + 8) = uVar26;
              pauVar27 = pauVar27 + 1;
              uVar36 = uVar34;
            }
          }
          else {
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar36;
            auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar26));
            auVar52._8_8_ = 0;
            auVar52._0_8_ = uVar34;
            auVar52 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar78));
            lVar30 = 0;
            for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              lVar30 = lVar30 + 1;
            }
            uVar33 = uVar33 - 1 & uVar33;
            uVar36 = (ulong)uVar33;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = *(ulong *)(uVar29 + lVar30 * 8);
            auVar49 = vpunpcklqdq_avx(auVar55,ZEXT416(*(uint *)(local_2700 + lVar30 * 4)));
            auVar55 = vpcmpgtd_avx(auVar52,auVar48);
            if (uVar33 == 0) {
              auVar60 = vpshufd_avx(auVar55,0xaa);
              auVar55 = vblendvps_avx(auVar52,auVar48,auVar60);
              auVar48 = vblendvps_avx(auVar48,auVar52,auVar60);
              auVar52 = vpcmpgtd_avx(auVar49,auVar55);
              auVar60 = vpshufd_avx(auVar52,0xaa);
              auVar52 = vblendvps_avx(auVar49,auVar55,auVar60);
              auVar55 = vblendvps_avx(auVar55,auVar49,auVar60);
              auVar49 = vpcmpgtd_avx(auVar55,auVar48);
              auVar60 = vpshufd_avx(auVar49,0xaa);
              auVar49 = vblendvps_avx(auVar55,auVar48,auVar60);
              auVar48 = vblendvps_avx(auVar48,auVar55,auVar60);
              *pauVar27 = auVar48;
              pauVar27[1] = auVar49;
              uVar36 = auVar52._0_8_;
              pauVar27 = pauVar27 + 2;
            }
            else {
              lVar30 = 0;
              for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                lVar30 = lVar30 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              uVar34 = (ulong)uVar33;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = *(ulong *)(uVar29 + lVar30 * 8);
              auVar60 = vpunpcklqdq_avx(auVar60,ZEXT416(*(uint *)(local_2700 + lVar30 * 4)));
              if (uVar33 == 0) {
                auVar43 = vpshufd_avx(auVar55,0xaa);
                auVar55 = vblendvps_avx(auVar52,auVar48,auVar43);
                auVar48 = vblendvps_avx(auVar48,auVar52,auVar43);
                auVar52 = vpcmpgtd_avx(auVar60,auVar49);
                auVar43 = vpshufd_avx(auVar52,0xaa);
                auVar52 = vblendvps_avx(auVar60,auVar49,auVar43);
                auVar49 = vblendvps_avx(auVar49,auVar60,auVar43);
                auVar60 = vpcmpgtd_avx(auVar49,auVar48);
                auVar43 = vpshufd_avx(auVar60,0xaa);
                auVar60 = vblendvps_avx(auVar49,auVar48,auVar43);
                auVar48 = vblendvps_avx(auVar48,auVar49,auVar43);
                auVar49 = vpcmpgtd_avx(auVar52,auVar55);
                auVar43 = vpshufd_avx(auVar49,0xaa);
                auVar49 = vblendvps_avx(auVar52,auVar55,auVar43);
                auVar52 = vblendvps_avx(auVar55,auVar52,auVar43);
                auVar55 = vpcmpgtd_avx(auVar60,auVar52);
                auVar43 = vpshufd_avx(auVar55,0xaa);
                auVar55 = vblendvps_avx(auVar60,auVar52,auVar43);
                auVar52 = vblendvps_avx(auVar52,auVar60,auVar43);
                *pauVar27 = auVar48;
                pauVar27[1] = auVar52;
                pauVar27[2] = auVar55;
                uVar36 = auVar49._0_8_;
                pauVar41 = pauVar27 + 3;
              }
              else {
                *pauVar27 = auVar48;
                pauVar27[1] = auVar52;
                pauVar27[2] = auVar49;
                pauVar27[3] = auVar60;
                lVar30 = 0x30;
                do {
                  lVar28 = lVar30;
                  lVar30 = 0;
                  for (uVar36 = uVar34; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000
                      ) {
                    lVar30 = lVar30 + 1;
                  }
                  uVar36 = *(ulong *)(uVar29 + lVar30 * 8);
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = uVar36;
                  auVar48 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_2700 + lVar30 * 4)));
                  *(undefined1 (*) [16])(pauVar27[1] + lVar28) = auVar48;
                  uVar34 = uVar34 - 1 & uVar34;
                  lVar30 = lVar28 + 0x10;
                } while (uVar34 != 0);
                pauVar41 = (undefined1 (*) [16])(pauVar27[1] + lVar28);
                if (lVar28 + 0x10 != 0) {
                  lVar30 = 0x10;
                  pauVar35 = pauVar27;
                  do {
                    auVar48 = pauVar35[1];
                    pauVar35 = pauVar35 + 1;
                    uVar33 = vextractps_avx(auVar48,2);
                    lVar28 = lVar30;
                    do {
                      if (uVar33 <= *(uint *)(pauVar27[-1] + lVar28 + 8)) {
                        pauVar37 = (undefined1 (*) [16])(*pauVar27 + lVar28);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar27 + lVar28) =
                           *(undefined1 (*) [16])(pauVar27[-1] + lVar28);
                      lVar28 = lVar28 + -0x10;
                      pauVar37 = pauVar27;
                    } while (lVar28 != 0);
                    *pauVar37 = auVar48;
                    lVar30 = lVar30 + 0x10;
                  } while (pauVar41 != pauVar35);
                  uVar36 = *(ulong *)*pauVar41;
                }
              }
              auVar65 = ZEXT3264(auVar63);
              auVar67 = ZEXT3264(auVar50);
              auVar71 = ZEXT3264(auVar69);
              auVar77 = ZEXT3264(auVar75);
              auVar83 = ZEXT3264(auVar80);
              auVar85 = ZEXT3264(auVar85._0_32_);
              pauVar27 = pauVar41;
            }
          }
        }
      }
      local_2848 = (ulong)((uint)uVar36 & 0xf) - 8;
      if (local_2848 != 0) {
        uVar36 = uVar36 & 0xfffffffffffffff0;
        local_2858 = 0;
        do {
          lVar28 = local_2858 * 0x60;
          pSVar4 = context->scene;
          ppfVar5 = (pSVar4->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar36 + 0x40 + lVar28)];
          auVar53._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x20 + lVar28));
          auVar53._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + lVar28));
          pfVar7 = ppfVar5[*(uint *)(uVar36 + 0x48 + lVar28)];
          auVar57._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x28 + lVar28));
          auVar57._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 8 + lVar28));
          pfVar8 = ppfVar5[*(uint *)(uVar36 + 0x44 + lVar28)];
          auVar61._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x24 + lVar28));
          auVar61._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 4 + lVar28));
          pfVar9 = ppfVar5[*(uint *)(uVar36 + 0x4c + lVar28)];
          auVar76._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar36 + 0x2c + lVar28));
          auVar76._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar36 + 0xc + lVar28));
          lVar30 = uVar36 + 0x40 + lVar28;
          local_23c0 = *(undefined8 *)(lVar30 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar30 + 0x18);
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          lVar30 = uVar36 + 0x50 + lVar28;
          local_27c0 = *(undefined8 *)(lVar30 + 0x10);
          uStack_27b8 = *(undefined8 *)(lVar30 + 0x18);
          auVar55 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x10 + lVar28))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar36 + 0x18 + lVar28)));
          auVar48 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x10 + lVar28))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar36 + 0x18 + lVar28)));
          auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x14 + lVar28))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar36 + 0x1c + lVar28)));
          auVar52 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x14 + lVar28))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar36 + 0x1c + lVar28)));
          auVar60 = vunpcklps_avx(auVar48,auVar52);
          auVar43 = vunpcklps_avx(auVar55,auVar49);
          auVar48 = vunpckhps_avx(auVar55,auVar49);
          auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x30 + lVar28))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar36 + 0x38 + lVar28)));
          auVar52 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x30 + lVar28))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar36 + 0x38 + lVar28)));
          auVar16 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x34 + lVar28))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar36 + 0x3c + lVar28)));
          auVar55 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x34 + lVar28))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar36 + 0x3c + lVar28)));
          auVar55 = vunpcklps_avx(auVar52,auVar55);
          auVar17 = vunpcklps_avx(auVar49,auVar16);
          auVar52 = vunpckhps_avx(auVar49,auVar16);
          uStack_27b0 = local_27c0;
          uStack_27a8 = uStack_27b8;
          auVar66 = vunpcklps_avx(auVar61,auVar76);
          auVar56 = vunpcklps_avx(auVar53,auVar57);
          auVar80 = vunpcklps_avx(auVar56,auVar66);
          auVar64 = vunpckhps_avx(auVar56,auVar66);
          auVar66 = vunpckhps_avx(auVar61,auVar76);
          auVar56 = vunpckhps_avx(auVar53,auVar57);
          auVar53 = vunpcklps_avx(auVar56,auVar66);
          auVar54._16_16_ = auVar43;
          auVar54._0_16_ = auVar43;
          auVar58._16_16_ = auVar48;
          auVar58._0_16_ = auVar48;
          auVar50._16_16_ = auVar60;
          auVar50._0_16_ = auVar60;
          auVar62._16_16_ = auVar17;
          auVar62._0_16_ = auVar17;
          auVar81._16_16_ = auVar52;
          auVar81._0_16_ = auVar52;
          auVar44._16_16_ = auVar55;
          auVar44._0_16_ = auVar55;
          auVar56 = vsubps_avx(auVar80,auVar54);
          auVar66 = vsubps_avx(auVar64,auVar58);
          auVar63 = vsubps_avx(auVar53,auVar50);
          auVar50 = vsubps_avx(auVar62,auVar80);
          auVar69 = vsubps_avx(auVar81,auVar64);
          auVar75 = vsubps_avx(auVar44,auVar53);
          auVar18._4_4_ = auVar66._4_4_ * auVar75._4_4_;
          auVar18._0_4_ = auVar66._0_4_ * auVar75._0_4_;
          auVar18._8_4_ = auVar66._8_4_ * auVar75._8_4_;
          auVar18._12_4_ = auVar66._12_4_ * auVar75._12_4_;
          auVar18._16_4_ = auVar66._16_4_ * auVar75._16_4_;
          auVar18._20_4_ = auVar66._20_4_ * auVar75._20_4_;
          auVar18._24_4_ = auVar66._24_4_ * auVar75._24_4_;
          auVar18._28_4_ = auVar55._12_4_;
          auVar49 = vfmsub231ps_fma(auVar18,auVar69,auVar63);
          uVar88 = *(undefined4 *)(ray + k * 4);
          auVar59._4_4_ = uVar88;
          auVar59._0_4_ = uVar88;
          auVar59._8_4_ = uVar88;
          auVar59._12_4_ = uVar88;
          auVar59._16_4_ = uVar88;
          auVar59._20_4_ = uVar88;
          auVar59._24_4_ = uVar88;
          auVar59._28_4_ = uVar88;
          uVar88 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar89._4_4_ = uVar88;
          auVar89._0_4_ = uVar88;
          auVar89._8_4_ = uVar88;
          auVar89._12_4_ = uVar88;
          auVar89._16_4_ = uVar88;
          auVar89._20_4_ = uVar88;
          auVar89._24_4_ = uVar88;
          auVar89._28_4_ = uVar88;
          uVar88 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar91._4_4_ = uVar88;
          auVar91._0_4_ = uVar88;
          auVar91._8_4_ = uVar88;
          auVar91._12_4_ = uVar88;
          auVar91._16_4_ = uVar88;
          auVar91._20_4_ = uVar88;
          auVar91._24_4_ = uVar88;
          auVar91._28_4_ = uVar88;
          fVar1 = *(float *)(ray + k * 4 + 0x40);
          auVar82._4_4_ = fVar1;
          auVar82._0_4_ = fVar1;
          auVar82._8_4_ = fVar1;
          auVar82._12_4_ = fVar1;
          auVar82._16_4_ = fVar1;
          auVar82._20_4_ = fVar1;
          auVar82._24_4_ = fVar1;
          auVar82._28_4_ = fVar1;
          auVar19._4_4_ = auVar63._4_4_ * auVar50._4_4_;
          auVar19._0_4_ = auVar63._0_4_ * auVar50._0_4_;
          auVar19._8_4_ = auVar63._8_4_ * auVar50._8_4_;
          auVar19._12_4_ = auVar63._12_4_ * auVar50._12_4_;
          auVar19._16_4_ = auVar63._16_4_ * auVar50._16_4_;
          auVar19._20_4_ = auVar63._20_4_ * auVar50._20_4_;
          auVar19._24_4_ = auVar63._24_4_ * auVar50._24_4_;
          auVar19._28_4_ = auVar60._12_4_;
          auVar80 = vsubps_avx(auVar80,auVar59);
          fVar2 = *(float *)(ray + k * 4 + 0x50);
          auVar86._4_4_ = fVar2;
          auVar86._0_4_ = fVar2;
          auVar86._8_4_ = fVar2;
          auVar86._12_4_ = fVar2;
          auVar86._16_4_ = fVar2;
          auVar86._20_4_ = fVar2;
          auVar86._24_4_ = fVar2;
          auVar86._28_4_ = fVar2;
          auVar60 = vfmsub231ps_fma(auVar19,auVar75,auVar56);
          auVar64 = vsubps_avx(auVar64,auVar89);
          fVar68 = *(float *)(ray + k * 4 + 0x60);
          auVar90._4_4_ = fVar68;
          auVar90._0_4_ = fVar68;
          auVar90._8_4_ = fVar68;
          auVar90._12_4_ = fVar68;
          auVar90._16_4_ = fVar68;
          auVar90._20_4_ = fVar68;
          auVar90._24_4_ = fVar68;
          auVar90._28_4_ = fVar68;
          auVar53 = vsubps_avx(auVar53,auVar91);
          auVar20._4_4_ = fVar1 * auVar64._4_4_;
          auVar20._0_4_ = fVar1 * auVar64._0_4_;
          auVar20._8_4_ = fVar1 * auVar64._8_4_;
          auVar20._12_4_ = fVar1 * auVar64._12_4_;
          auVar20._16_4_ = fVar1 * auVar64._16_4_;
          auVar20._20_4_ = fVar1 * auVar64._20_4_;
          auVar20._24_4_ = fVar1 * auVar64._24_4_;
          auVar20._28_4_ = uVar88;
          auVar48 = vfmsub231ps_fma(auVar20,auVar80,auVar86);
          auVar21._4_4_ = auVar75._4_4_ * auVar48._4_4_;
          auVar21._0_4_ = auVar75._0_4_ * auVar48._0_4_;
          auVar21._8_4_ = auVar75._8_4_ * auVar48._8_4_;
          auVar21._12_4_ = auVar75._12_4_ * auVar48._12_4_;
          auVar21._16_4_ = auVar75._16_4_ * 0.0;
          auVar21._20_4_ = auVar75._20_4_ * 0.0;
          auVar21._24_4_ = auVar75._24_4_ * 0.0;
          auVar21._28_4_ = auVar75._28_4_;
          auVar92._0_4_ = auVar63._0_4_ * auVar48._0_4_;
          auVar92._4_4_ = auVar63._4_4_ * auVar48._4_4_;
          auVar92._8_4_ = auVar63._8_4_ * auVar48._8_4_;
          auVar92._12_4_ = auVar63._12_4_ * auVar48._12_4_;
          auVar92._16_4_ = auVar63._16_4_ * 0.0;
          auVar92._20_4_ = auVar63._20_4_ * 0.0;
          auVar92._24_4_ = auVar63._24_4_ * 0.0;
          auVar92._28_4_ = 0;
          auVar75._4_4_ = fVar68 * auVar80._4_4_;
          auVar75._0_4_ = fVar68 * auVar80._0_4_;
          auVar75._8_4_ = fVar68 * auVar80._8_4_;
          auVar75._12_4_ = fVar68 * auVar80._12_4_;
          auVar75._16_4_ = fVar68 * auVar80._16_4_;
          auVar75._20_4_ = fVar68 * auVar80._20_4_;
          auVar75._24_4_ = fVar68 * auVar80._24_4_;
          auVar75._28_4_ = auVar63._28_4_;
          auVar52 = vfmsub231ps_fma(auVar75,auVar53,auVar82);
          auVar48 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar52),auVar69);
          auVar52 = vfmadd231ps_fma(auVar92,auVar66,ZEXT1632(auVar52));
          auVar63._4_4_ = auVar56._4_4_ * auVar69._4_4_;
          auVar63._0_4_ = auVar56._0_4_ * auVar69._0_4_;
          auVar63._8_4_ = auVar56._8_4_ * auVar69._8_4_;
          auVar63._12_4_ = auVar56._12_4_ * auVar69._12_4_;
          auVar63._16_4_ = auVar56._16_4_ * auVar69._16_4_;
          auVar63._20_4_ = auVar56._20_4_ * auVar69._20_4_;
          auVar63._24_4_ = auVar56._24_4_ * auVar69._24_4_;
          auVar63._28_4_ = auVar69._28_4_;
          auVar43 = vfmsub231ps_fma(auVar63,auVar50,auVar66);
          auVar69._4_4_ = fVar2 * auVar53._4_4_;
          auVar69._0_4_ = fVar2 * auVar53._0_4_;
          auVar69._8_4_ = fVar2 * auVar53._8_4_;
          auVar69._12_4_ = fVar2 * auVar53._12_4_;
          auVar69._16_4_ = fVar2 * auVar53._16_4_;
          auVar69._20_4_ = fVar2 * auVar53._20_4_;
          auVar69._24_4_ = fVar2 * auVar53._24_4_;
          auVar69._28_4_ = auVar66._28_4_;
          auVar16 = vfmsub231ps_fma(auVar69,auVar64,auVar90);
          fVar1 = auVar43._0_4_;
          fVar2 = auVar43._4_4_;
          auVar22._4_4_ = fVar68 * fVar2;
          auVar22._0_4_ = fVar68 * fVar1;
          fVar11 = auVar43._8_4_;
          auVar22._8_4_ = fVar68 * fVar11;
          fVar12 = auVar43._12_4_;
          auVar22._12_4_ = fVar68 * fVar12;
          auVar22._16_4_ = fVar68 * 0.0;
          auVar22._20_4_ = fVar68 * 0.0;
          auVar22._24_4_ = fVar68 * 0.0;
          auVar22._28_4_ = fVar68;
          auVar55 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar60),auVar86);
          auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar49),auVar82);
          auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),ZEXT1632(auVar16),auVar50);
          auVar66 = vandps_avx(ZEXT1632(auVar55),local_23e0);
          uVar33 = auVar66._0_4_;
          local_2700._0_4_ = (float)(uVar33 ^ auVar48._0_4_);
          uVar26 = auVar66._4_4_;
          local_2700._4_4_ = (float)(uVar26 ^ auVar48._4_4_);
          uVar78 = auVar66._8_4_;
          local_2700._8_4_ = (float)(uVar78 ^ auVar48._8_4_);
          uVar79 = auVar66._12_4_;
          local_2700._12_4_ = (float)(uVar79 ^ auVar48._12_4_);
          local_26c0._16_4_ = auVar66._16_4_;
          local_2700._16_4_ = local_26c0._16_4_;
          local_26c0._20_4_ = auVar66._20_4_;
          local_2700._20_4_ = local_26c0._20_4_;
          local_26c0._24_4_ = auVar66._24_4_;
          local_2700._24_4_ = local_26c0._24_4_;
          local_26c0._28_4_ = auVar66._28_4_;
          local_2700._28_4_ = local_26c0._28_4_;
          auVar48 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar56,ZEXT1632(auVar16));
          local_26e0._0_4_ = (float)(uVar33 ^ auVar48._0_4_);
          local_26e0._4_4_ = (float)(uVar26 ^ auVar48._4_4_);
          local_26e0._8_4_ = (float)(uVar78 ^ auVar48._8_4_);
          local_26e0._12_4_ = (float)(uVar79 ^ auVar48._12_4_);
          local_26e0._16_4_ = local_26c0._16_4_;
          local_26e0._20_4_ = local_26c0._20_4_;
          local_26e0._24_4_ = local_26c0._24_4_;
          local_26e0._28_4_ = local_26c0._28_4_;
          auVar66 = vcmpps_avx(local_2700,ZEXT832(0) << 0x20,5);
          auVar56 = vcmpps_avx(local_26e0,ZEXT832(0) << 0x20,5);
          auVar66 = vandps_avx(auVar66,auVar56);
          auVar70._8_4_ = 0x7fffffff;
          auVar70._0_8_ = 0x7fffffff7fffffff;
          auVar70._12_4_ = 0x7fffffff;
          auVar70._16_4_ = 0x7fffffff;
          auVar70._20_4_ = 0x7fffffff;
          auVar70._24_4_ = 0x7fffffff;
          auVar70._28_4_ = 0x7fffffff;
          local_26a0 = vandps_avx(ZEXT1632(auVar55),auVar70);
          auVar56 = vcmpps_avx(ZEXT1632(auVar55),ZEXT832(0) << 0x20,4);
          auVar66 = vandps_avx(auVar66,auVar56);
          auVar84._0_4_ = local_2700._0_4_ + local_26e0._0_4_;
          auVar84._4_4_ = local_2700._4_4_ + local_26e0._4_4_;
          auVar84._8_4_ = local_2700._8_4_ + local_26e0._8_4_;
          auVar84._12_4_ = local_2700._12_4_ + local_26e0._12_4_;
          auVar84._16_4_ = local_26c0._16_4_ + local_26c0._16_4_;
          auVar84._20_4_ = local_26c0._20_4_ + local_26c0._20_4_;
          auVar84._24_4_ = local_26c0._24_4_ + local_26c0._24_4_;
          auVar84._28_4_ = local_26c0._28_4_ + local_26c0._28_4_;
          auVar56 = vcmpps_avx(auVar84,local_26a0,2);
          auVar63 = auVar56 & auVar66;
          if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar63 >> 0x7f,0) != '\0') ||
                (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar63 >> 0xbf,0) != '\0') ||
              (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar63[0x1f] < '\0') {
            auVar66 = vandps_avx(auVar66,auVar56);
            auVar48 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
            auVar23._4_4_ = fVar2 * auVar53._4_4_;
            auVar23._0_4_ = fVar1 * auVar53._0_4_;
            auVar23._8_4_ = fVar11 * auVar53._8_4_;
            auVar23._12_4_ = fVar12 * auVar53._12_4_;
            auVar23._16_4_ = auVar53._16_4_ * 0.0;
            auVar23._20_4_ = auVar53._20_4_ * 0.0;
            auVar23._24_4_ = auVar53._24_4_ * 0.0;
            auVar23._28_4_ = auVar53._28_4_;
            auVar52 = vfmadd213ps_fma(auVar64,ZEXT1632(auVar60),auVar23);
            auVar52 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar49),ZEXT1632(auVar52));
            local_26c0._0_4_ = (float)(uVar33 ^ auVar52._0_4_);
            local_26c0._4_4_ = (float)(uVar26 ^ auVar52._4_4_);
            local_26c0._8_4_ = (float)(uVar78 ^ auVar52._8_4_);
            local_26c0._12_4_ = (float)(uVar79 ^ auVar52._12_4_);
            fVar68 = *(float *)(ray + k * 4 + 0x30);
            auVar80._4_4_ = local_26a0._4_4_ * fVar68;
            auVar80._0_4_ = local_26a0._0_4_ * fVar68;
            auVar80._8_4_ = local_26a0._8_4_ * fVar68;
            auVar80._12_4_ = local_26a0._12_4_ * fVar68;
            auVar80._16_4_ = local_26a0._16_4_ * fVar68;
            auVar80._20_4_ = local_26a0._20_4_ * fVar68;
            auVar80._24_4_ = local_26a0._24_4_ * fVar68;
            auVar80._28_4_ = fVar68;
            auVar66 = vcmpps_avx(auVar80,local_26c0,1);
            fVar68 = *(float *)(ray + k * 4 + 0x80);
            auVar65 = ZEXT3264(CONCAT428(fVar68,CONCAT424(fVar68,CONCAT420(fVar68,CONCAT416(fVar68,
                                                  CONCAT412(fVar68,CONCAT48(fVar68,CONCAT44(fVar68,
                                                  fVar68))))))));
            auVar64._0_4_ = local_26a0._0_4_ * fVar68;
            auVar64._4_4_ = local_26a0._4_4_ * fVar68;
            auVar64._8_4_ = local_26a0._8_4_ * fVar68;
            auVar64._12_4_ = local_26a0._12_4_ * fVar68;
            auVar64._16_4_ = local_26a0._16_4_ * fVar68;
            auVar64._20_4_ = local_26a0._20_4_ * fVar68;
            auVar64._24_4_ = local_26a0._24_4_ * fVar68;
            auVar64._28_4_ = 0;
            auVar56 = vcmpps_avx(local_26c0,auVar64,2);
            auVar66 = vandps_avx(auVar66,auVar56);
            auVar52 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
            auVar48 = vpand_avx(auVar48,auVar52);
            auVar66 = vpmovzxwd_avx2(auVar48);
            auVar66 = vpslld_avx2(auVar66,0x1f);
            if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar66 >> 0x7f,0) != '\0') ||
                  (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0xbf,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar66[0x1f] < '\0') {
              local_2800 = vpsrad_avx2(auVar66,0x1f);
              local_2680 = ZEXT1632(auVar49);
              local_2660 = ZEXT1632(auVar60);
              local_2640 = ZEXT1632(auVar43);
              local_2620 = local_2800;
              local_2540 = local_24c0;
              auVar56 = vrcpps_avx(local_26a0);
              auVar87._8_4_ = 0x3f800000;
              auVar87._0_8_ = 0x3f8000003f800000;
              auVar87._12_4_ = 0x3f800000;
              auVar87._16_4_ = 0x3f800000;
              auVar87._20_4_ = 0x3f800000;
              auVar87._24_4_ = 0x3f800000;
              auVar87._28_4_ = 0x3f800000;
              auVar52 = vfnmadd213ps_fma(local_26a0,auVar56,auVar87);
              auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar56,auVar56);
              fVar68 = auVar52._0_4_;
              fVar72 = auVar52._4_4_;
              local_25c0._4_4_ = fVar72 * local_26c0._4_4_;
              local_25c0._0_4_ = fVar68 * local_26c0._0_4_;
              fVar73 = auVar52._8_4_;
              local_25c0._8_4_ = fVar73 * local_26c0._8_4_;
              fVar74 = auVar52._12_4_;
              local_25c0._12_4_ = fVar74 * local_26c0._12_4_;
              local_25c0._16_4_ = local_26c0._16_4_ * 0.0;
              local_25c0._20_4_ = local_26c0._20_4_ * 0.0;
              local_25c0._24_4_ = local_26c0._24_4_ * 0.0;
              local_25c0._28_4_ = auVar56._28_4_;
              auVar67 = ZEXT3264(local_25c0);
              auVar24._4_4_ = fVar72 * local_2700._4_4_;
              auVar24._0_4_ = fVar68 * local_2700._0_4_;
              auVar24._8_4_ = fVar73 * local_2700._8_4_;
              auVar24._12_4_ = fVar74 * local_2700._12_4_;
              auVar24._16_4_ = local_26c0._16_4_ * 0.0;
              auVar24._20_4_ = local_26c0._20_4_ * 0.0;
              auVar24._24_4_ = local_26c0._24_4_ * 0.0;
              auVar24._28_4_ = local_26c0._28_4_;
              auVar56 = vminps_avx(auVar24,auVar87);
              auVar25._4_4_ = fVar72 * local_26e0._4_4_;
              auVar25._0_4_ = fVar68 * local_26e0._0_4_;
              auVar25._8_4_ = fVar73 * local_26e0._8_4_;
              auVar25._12_4_ = fVar74 * local_26e0._12_4_;
              auVar25._16_4_ = local_26c0._16_4_ * 0.0;
              auVar25._20_4_ = local_26c0._20_4_ * 0.0;
              auVar25._24_4_ = local_26c0._24_4_ * 0.0;
              auVar25._28_4_ = local_26c0._28_4_;
              auVar63 = vminps_avx(auVar25,auVar87);
              auVar50 = vsubps_avx(auVar87,auVar56);
              auVar69 = vsubps_avx(auVar87,auVar63);
              local_25e0 = vblendvps_avx(auVar63,auVar50,local_24c0);
              local_2600 = vblendvps_avx(auVar56,auVar69,local_24c0);
              fVar68 = local_24e0._0_4_;
              local_25a0._0_4_ = auVar49._0_4_ * fVar68;
              fVar72 = local_24e0._4_4_;
              local_25a0._4_4_ = auVar49._4_4_ * fVar72;
              fVar73 = local_24e0._8_4_;
              local_25a0._8_4_ = auVar49._8_4_ * fVar73;
              fVar74 = local_24e0._12_4_;
              local_25a0._12_4_ = auVar49._12_4_ * fVar74;
              fVar13 = local_24e0._16_4_;
              local_25a0._16_4_ = fVar13 * 0.0;
              fVar14 = local_24e0._20_4_;
              local_25a0._20_4_ = fVar14 * 0.0;
              fVar15 = local_24e0._24_4_;
              local_25a0._24_4_ = fVar15 * 0.0;
              local_25a0._28_4_ = 0;
              local_2580._0_4_ = fVar68 * auVar60._0_4_;
              local_2580._4_4_ = fVar72 * auVar60._4_4_;
              local_2580._8_4_ = fVar73 * auVar60._8_4_;
              local_2580._12_4_ = fVar74 * auVar60._12_4_;
              local_2580._16_4_ = fVar13 * 0.0;
              local_2580._20_4_ = fVar14 * 0.0;
              local_2580._24_4_ = fVar15 * 0.0;
              local_2580._28_4_ = 0;
              local_2560._0_4_ = fVar68 * fVar1;
              local_2560._4_4_ = fVar72 * fVar2;
              local_2560._8_4_ = fVar73 * fVar11;
              local_2560._12_4_ = fVar74 * fVar12;
              local_2560._16_4_ = fVar13 * 0.0;
              local_2560._20_4_ = fVar14 * 0.0;
              local_2560._24_4_ = fVar15 * 0.0;
              local_2560._28_4_ = 0;
              auVar45._8_4_ = 0x7f800000;
              auVar45._0_8_ = 0x7f8000007f800000;
              auVar45._12_4_ = 0x7f800000;
              auVar45._16_4_ = 0x7f800000;
              auVar45._20_4_ = 0x7f800000;
              auVar45._24_4_ = 0x7f800000;
              auVar45._28_4_ = 0x7f800000;
              auVar66 = vblendvps_avx(auVar45,local_25c0,auVar66);
              auVar56 = vshufps_avx(auVar66,auVar66,0xb1);
              auVar56 = vminps_avx(auVar66,auVar56);
              auVar63 = vshufpd_avx(auVar56,auVar56,5);
              auVar56 = vminps_avx(auVar56,auVar63);
              auVar63 = vpermpd_avx2(auVar56,0x4e);
              auVar56 = vminps_avx(auVar56,auVar63);
              auVar66 = vcmpps_avx(auVar66,auVar56,0);
              auVar52 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
              auVar48 = vpand_avx(auVar52,auVar48);
              auVar66 = vpmovzxwd_avx2(auVar48);
              auVar66 = vpslld_avx2(auVar66,0x1f);
              if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar66 >> 0x7f,0) == '\0') &&
                    (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar66 >> 0xbf,0) == '\0') &&
                  (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar66[0x1f]) {
                auVar66 = local_2800;
              }
              uVar26 = vmovmskps_avx(auVar66);
              uVar33 = 0;
              for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
                uVar33 = uVar33 + 1;
              }
              do {
                local_2860 = (ulong)uVar33;
                uVar33 = *(uint *)((long)&local_23c0 + local_2860 * 4);
                local_2868 = (pSVar4->geometries).items[uVar33].ptr;
                if ((local_2868->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2800 + local_2860 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_2868->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar88 = *(undefined4 *)(local_2600 + local_2860 * 4);
                    uVar3 = *(undefined4 *)(local_25e0 + local_2860 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) =
                         *(undefined4 *)(local_25c0 + local_2860 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) =
                         *(undefined4 *)(local_25a0 + local_2860 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) =
                         *(undefined4 *)(local_2580 + local_2860 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) =
                         *(undefined4 *)(local_2560 + local_2860 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar88;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_27c0 + local_2860 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar33;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_2520 = auVar67._0_32_;
                  local_27e0 = auVar65._0_32_;
                  local_2500 = auVar93._0_32_;
                  uVar88 = *(undefined4 *)(local_2600 + local_2860 * 4);
                  local_2760._4_4_ = uVar88;
                  local_2760._0_4_ = uVar88;
                  local_2760._8_4_ = uVar88;
                  local_2760._12_4_ = uVar88;
                  local_2750 = *(undefined4 *)(local_25e0 + local_2860 * 4);
                  local_2730._4_4_ = uVar33;
                  local_2730._0_4_ = uVar33;
                  local_2730._8_4_ = uVar33;
                  local_2730._12_4_ = uVar33;
                  uVar88 = *(undefined4 *)((long)&local_27c0 + local_2860 * 4);
                  local_2740._4_4_ = uVar88;
                  local_2740._0_4_ = uVar88;
                  local_2740._8_4_ = uVar88;
                  local_2740._12_4_ = uVar88;
                  uVar88 = *(undefined4 *)(local_25a0 + local_2860 * 4);
                  uVar3 = *(undefined4 *)(local_2580 + local_2860 * 4);
                  local_2780._4_4_ = uVar3;
                  local_2780._0_4_ = uVar3;
                  local_2780._8_4_ = uVar3;
                  local_2780._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_2560 + local_2860 * 4);
                  local_2770._4_4_ = uVar3;
                  local_2770._0_4_ = uVar3;
                  local_2770._8_4_ = uVar3;
                  local_2770._12_4_ = uVar3;
                  local_2790[0] = (RTCHitN)(char)uVar88;
                  local_2790[1] = (RTCHitN)(char)((uint)uVar88 >> 8);
                  local_2790[2] = (RTCHitN)(char)((uint)uVar88 >> 0x10);
                  local_2790[3] = (RTCHitN)(char)((uint)uVar88 >> 0x18);
                  local_2790[4] = (RTCHitN)(char)uVar88;
                  local_2790[5] = (RTCHitN)(char)((uint)uVar88 >> 8);
                  local_2790[6] = (RTCHitN)(char)((uint)uVar88 >> 0x10);
                  local_2790[7] = (RTCHitN)(char)((uint)uVar88 >> 0x18);
                  local_2790[8] = (RTCHitN)(char)uVar88;
                  local_2790[9] = (RTCHitN)(char)((uint)uVar88 >> 8);
                  local_2790[10] = (RTCHitN)(char)((uint)uVar88 >> 0x10);
                  local_2790[0xb] = (RTCHitN)(char)((uint)uVar88 >> 0x18);
                  local_2790[0xc] = (RTCHitN)(char)uVar88;
                  local_2790[0xd] = (RTCHitN)(char)((uint)uVar88 >> 8);
                  local_2790[0xe] = (RTCHitN)(char)((uint)uVar88 >> 0x10);
                  local_2790[0xf] = (RTCHitN)(char)((uint)uVar88 >> 0x18);
                  uStack_274c = local_2750;
                  uStack_2748 = local_2750;
                  uStack_2744 = local_2750;
                  vpcmpeqd_avx2(ZEXT1632(local_2760),ZEXT1632(local_2760));
                  uStack_271c = context->user->instID[0];
                  local_2720 = uStack_271c;
                  uStack_2718 = uStack_271c;
                  uStack_2714 = uStack_271c;
                  uStack_2710 = context->user->instPrimID[0];
                  uStack_270c = uStack_2710;
                  uStack_2708 = uStack_2710;
                  uStack_2704 = uStack_2710;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + local_2860 * 4)
                  ;
                  local_2880 = *local_2850;
                  local_2830.valid = (int *)local_2880;
                  local_2830.geometryUserPtr = local_2868->userPtr;
                  local_2830.context = context->user;
                  local_2830.hit = local_2790;
                  local_2830.N = 4;
                  local_2830.ray = (RTCRayN *)ray;
                  if (local_2868->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*local_2868->intersectionFilterN)(&local_2830);
                  }
                  if (local_2880 == (undefined1  [16])0x0) {
                    auVar48 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar48 = auVar48 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_2868->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_2830);
                    }
                    auVar52 = vpcmpeqd_avx(local_2880,_DAT_01f7aa10);
                    auVar48 = auVar52 ^ _DAT_01f7ae20;
                    if (local_2880 != (undefined1  [16])0x0) {
                      auVar52 = auVar52 ^ _DAT_01f7ae20;
                      auVar55 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])local_2830.hit);
                      *(undefined1 (*) [16])(local_2830.ray + 0xc0) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(local_2830.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0xd0) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(local_2830.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0xe0) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(local_2830.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0xf0) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(local_2830.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0x100) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(local_2830.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0x110) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(local_2830.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0x120) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(local_2830.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0x130) = auVar55;
                      auVar52 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(local_2830.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0x140) = auVar52;
                    }
                  }
                  auVar43._8_8_ = 0x100000001;
                  auVar43._0_8_ = 0x100000001;
                  if ((auVar43 & auVar48) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_27e0._0_4_;
                  }
                  else {
                    local_27e0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_2800 + local_2860 * 4) = 0;
                  auVar65 = ZEXT3264(local_27e0);
                  uVar88 = local_27e0._0_4_;
                  auVar46._4_4_ = uVar88;
                  auVar46._0_4_ = uVar88;
                  auVar46._8_4_ = uVar88;
                  auVar46._12_4_ = uVar88;
                  auVar46._16_4_ = uVar88;
                  auVar46._20_4_ = uVar88;
                  auVar46._24_4_ = uVar88;
                  auVar46._28_4_ = uVar88;
                  auVar67 = ZEXT3264(local_2520);
                  auVar66 = vcmpps_avx(local_2520,auVar46,2);
                  local_2800 = vandps_avx(auVar66,local_2800);
                  auVar93 = ZEXT3264(local_2500);
                }
                if ((((((((local_2800 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_2800 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_2800 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_2800 >> 0x7f,0) == '\0') &&
                      (local_2800 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_2800 >> 0xbf,0) == '\0') &&
                    (local_2800 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_2800[0x1f]) break;
                auVar51._8_4_ = 0x7f800000;
                auVar51._0_8_ = 0x7f8000007f800000;
                auVar51._12_4_ = 0x7f800000;
                auVar51._16_4_ = 0x7f800000;
                auVar51._20_4_ = 0x7f800000;
                auVar51._24_4_ = 0x7f800000;
                auVar51._28_4_ = 0x7f800000;
                auVar66 = vblendvps_avx(auVar51,auVar67._0_32_,local_2800);
                auVar56 = vshufps_avx(auVar66,auVar66,0xb1);
                auVar56 = vminps_avx(auVar66,auVar56);
                auVar63 = vshufpd_avx(auVar56,auVar56,5);
                auVar56 = vminps_avx(auVar56,auVar63);
                auVar63 = vpermpd_avx2(auVar56,0x4e);
                auVar56 = vminps_avx(auVar56,auVar63);
                auVar56 = vcmpps_avx(auVar66,auVar56,0);
                auVar63 = local_2800 & auVar56;
                auVar66 = local_2800;
                if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar63 >> 0x7f,0) != '\0') ||
                      (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar63 >> 0xbf,0) != '\0') ||
                    (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar63[0x1f] < '\0') {
                  auVar66 = vandps_avx(auVar56,local_2800);
                }
                uVar26 = vmovmskps_avx(auVar66);
                uVar33 = 0;
                for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
                  uVar33 = uVar33 + 1;
                }
              } while( true );
            }
          }
          local_2858 = local_2858 + 1;
        } while (local_2858 != local_2848);
      }
      uVar88 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar47 = ZEXT3264(CONCAT428(uVar88,CONCAT424(uVar88,CONCAT420(uVar88,CONCAT416(uVar88,
                                                  CONCAT412(uVar88,CONCAT48(uVar88,CONCAT44(uVar88,
                                                  uVar88))))))));
      auVar65 = ZEXT3264(local_2400);
      auVar67 = ZEXT3264(local_2420);
      auVar71 = ZEXT3264(local_2440);
      auVar77 = ZEXT3264(local_2460);
      auVar83 = ZEXT3264(local_2480);
      auVar85 = ZEXT3264(local_24a0);
    }
    if (pauVar27 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }